

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

vector<MapConnection_*,_std::allocator<MapConnection_*>_> * __thiscall
World::map_connections
          (vector<MapConnection_*,_std::allocator<MapConnection_*>_> *__return_storage_ptr__,
          World *this,uint16_t map_id_1,uint16_t map_id_2)

{
  pointer pMVar1;
  uint16_t uVar2;
  MapConnection *connection;
  pointer pMVar3;
  pointer local_38;
  
  (__return_storage_ptr__->super__Vector_base<MapConnection_*,_std::allocator<MapConnection_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MapConnection_*,_std::allocator<MapConnection_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MapConnection_*,_std::allocator<MapConnection_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar1 = (this->_map_connections).
           super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar3 = (this->_map_connections).
                super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    uVar2 = pMVar3->_map_id_1;
    if ((pMVar3->_map_id_1 == map_id_1) && (uVar2 = map_id_1, pMVar3->_map_id_2 == map_id_2)) {
      local_38 = pMVar3;
      std::vector<MapConnection*,std::allocator<MapConnection*>>::emplace_back<MapConnection*>
                ((vector<MapConnection*,std::allocator<MapConnection*>> *)__return_storage_ptr__,
                 &local_38);
      uVar2 = pMVar3->_map_id_1;
    }
    if ((uVar2 == map_id_2) && (pMVar3->_map_id_2 == map_id_1)) {
      local_38 = pMVar3;
      std::vector<MapConnection*,std::allocator<MapConnection*>>::emplace_back<MapConnection*>
                ((vector<MapConnection*,std::allocator<MapConnection*>> *)__return_storage_ptr__,
                 &local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MapConnection*> World::map_connections(uint16_t map_id_1, uint16_t map_id_2)
{
    std::vector<MapConnection*> connections;
    for(MapConnection& connection : _map_connections)
    {
        if(connection.map_id_1() == map_id_1 && connection.map_id_2() == map_id_2)
            connections.emplace_back(&connection);
        if(connection.map_id_1() == map_id_2 && connection.map_id_2() == map_id_1)
            connections.emplace_back(&connection);
    }

    return connections;
}